

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_ext_substmt(lysp_yang_ctx *ctx,ly_stmt kw,char *word,size_t word_len,lysp_stmt **child)

{
  LY_ERR LVar1;
  char **str_p;
  char *pcVar2;
  ly_ctx *local_98;
  char *local_90;
  ly_ctx *local_80;
  ly_ctx *local_78;
  ly_ctx *local_70;
  bool local_61;
  ly_bool __loop_end;
  LY_ERR ret___1;
  LY_ERR ret__;
  lysp_stmt *par_child;
  lysp_stmt *stmt;
  ly_stmt child_kw;
  LY_ERR ret;
  char *buf;
  lysp_stmt **child_local;
  size_t word_len_local;
  char *word_local;
  lysp_yang_ctx *plStack_18;
  ly_stmt kw_local;
  lysp_yang_ctx *ctx_local;
  
  stmt._4_4_ = 0;
  buf = (char *)child;
  child_local = (lysp_stmt **)word_len;
  word_len_local = (size_t)word;
  word_local._4_4_ = kw;
  plStack_18 = ctx;
  str_p = (char **)calloc(1,0x38);
  if (str_p == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_ext_substmt");
    return LY_EMEM;
  }
  if (*(long *)buf == 0) {
    *(char ***)buf = str_p;
  }
  else {
    for (_ret___1 = *(long *)buf; *(long *)(_ret___1 + 0x20) != 0;
        _ret___1 = *(long *)(_ret___1 + 0x20)) {
    }
    *(char ***)(_ret___1 + 0x20) = str_p;
  }
  if (plStack_18 == (lysp_yang_ctx *)0x0) {
    local_70 = (ly_ctx *)0x0;
  }
  else {
    local_70 = (ly_ctx *)
               **(undefined8 **)
                 (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
  }
  LVar1 = lydict_insert(local_70,(char *)word_len_local,(size_t)child_local,str_p);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  LVar1 = get_argument(plStack_18,Y_MAYBE_STR_ARG,(uint16_t *)(str_p + 6),(char **)&word_len_local,
                       (char **)&child_kw,(size_t *)&child_local);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if (word_len_local != 0) {
    if (_child_kw == (char *)0x0) {
      if (plStack_18 == (lysp_yang_ctx *)0x0) {
        local_80 = (ly_ctx *)0x0;
      }
      else {
        local_80 = (ly_ctx *)
                   **(undefined8 **)
                     (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
      }
      if (child_local == (lysp_stmt **)0x0) {
        local_90 = "";
      }
      else {
        local_90 = (char *)word_len_local;
      }
      LVar1 = lydict_insert(local_80,local_90,(size_t)child_local,str_p + 1);
    }
    else {
      if (plStack_18 == (lysp_yang_ctx *)0x0) {
        local_78 = (ly_ctx *)0x0;
      }
      else {
        local_78 = (ly_ctx *)
                   **(undefined8 **)
                     (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
      }
      LVar1 = lydict_insert_zc(local_78,(char *)word_len_local,str_p + 1);
    }
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    stmt._4_4_ = 0;
  }
  *(undefined4 *)(str_p + 2) = 1;
  str_p[3] = (char *)(plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
  *(ly_stmt *)((long)str_p + 0x34) = word_local._4_4_;
  stmt._4_4_ = get_keyword(plStack_18,(ly_stmt *)&stmt,(char **)&word_len_local,
                           (size_t *)&child_local);
  if (stmt._4_4_ != LY_SUCCESS) {
    return stmt._4_4_;
  }
  if ((ly_stmt)stmt == LY_STMT_SYNTAX_SEMICOLON) {
    local_61 = true;
    stmt._4_4_ = LY_SUCCESS;
  }
  else {
    if ((ly_stmt)stmt != LY_STMT_SYNTAX_LEFT_BRACE) {
      if (plStack_18 == (lysp_yang_ctx *)0x0) {
        local_98 = (ly_ctx *)0x0;
      }
      else {
        local_98 = (ly_ctx *)
                   **(undefined8 **)
                     (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
      }
      pcVar2 = lyplg_ext_stmt2str((ly_stmt)stmt);
      ly_vlog(local_98,(char *)0x0,LYVE_SYNTAX_YANG,
              "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar2);
      return LY_EVALID;
    }
    LVar1 = get_keyword(plStack_18,(ly_stmt *)&stmt,(char **)&word_len_local,(size_t *)&child_local)
    ;
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    local_61 = (ly_stmt)stmt == LY_STMT_SYNTAX_RIGHT_BRACE;
    stmt._4_4_ = LY_SUCCESS;
  }
  while (((!local_61 &&
          (stmt._4_4_ = parse_ext_substmt(plStack_18,(ly_stmt)stmt,(char *)word_len_local,
                                          (size_t)child_local,(lysp_stmt **)(str_p + 5)),
          stmt._4_4_ == LY_SUCCESS)) &&
         (stmt._4_4_ = get_keyword(plStack_18,(ly_stmt *)&stmt,(char **)&word_len_local,
                                   (size_t *)&child_local), stmt._4_4_ == LY_SUCCESS))) {
    if ((ly_stmt)stmt == LY_STMT_SYNTAX_RIGHT_BRACE) {
      local_61 = true;
    }
  }
  return stmt._4_4_;
}

Assistant:

static LY_ERR
parse_ext_substmt(struct lysp_yang_ctx *ctx, enum ly_stmt kw, char *word, size_t word_len,
        struct lysp_stmt **child)
{
    char *buf;
    LY_ERR ret = LY_SUCCESS;
    enum ly_stmt child_kw;
    struct lysp_stmt *stmt, *par_child;

    stmt = calloc(1, sizeof *stmt);
    LY_CHECK_ERR_RET(!stmt, LOGMEM(NULL), LY_EMEM);

    /* insert into parent statements */
    if (!*child) {
        *child = stmt;
    } else {
        for (par_child = *child; par_child->next; par_child = par_child->next) {}
        par_child->next = stmt;
    }

    /* statement */
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), word, word_len, &stmt->stmt));

    /* get optional argument */
    LY_CHECK_RET(get_argument(ctx, Y_MAYBE_STR_ARG, &stmt->flags, &word, &buf, &word_len));
    if (word) {
        INSERT_WORD_GOTO(ctx, buf, stmt->arg, word, word_len, ret, cleanup);
    }

    stmt->format = LY_VALUE_SCHEMA;
    stmt->prefix_data = PARSER_CUR_PMOD(ctx);
    stmt->kw = kw;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, child_kw, word, word_len, ret, cleanup) {
        LY_CHECK_GOTO(ret = parse_ext_substmt(ctx, child_kw, word, word_len, &stmt->child), cleanup)
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, child_kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}